

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

int ImStb::is_word_boundary_from_right(ImGuiInputTextState *obj,int idx)

{
  bool bVar1;
  unsigned_short *puVar2;
  uint uVar3;
  
  uVar3 = 0;
  if ((obj->Flags & 0x8000) == 0) {
    if (idx < 1) {
      uVar3 = 1;
    }
    else {
      puVar2 = ImVector<unsigned_short>::operator[](&obj->TextW,idx + -1);
      bVar1 = is_separator((uint)*puVar2);
      if (bVar1) {
        puVar2 = ImVector<unsigned_short>::operator[](&obj->TextW,idx);
        bVar1 = is_separator((uint)*puVar2);
        uVar3 = (uint)!bVar1;
      }
    }
  }
  return uVar3;
}

Assistant:

static int  is_word_boundary_from_right(ImGuiInputTextState* obj, int idx)      { if (obj->Flags & ImGuiInputTextFlags_Password) return 0; return idx > 0 ? (is_separator(obj->TextW[idx - 1]) && !is_separator(obj->TextW[idx]) ) : 1; }